

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

reverse_iterator __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
rbegin(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this)

{
  iterator __x;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RSI;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  __x = end(in_RSI);
  std::
  reverse_iterator<google::protobuf::internal::RepeatedPtrIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reverse_iterator((reverse_iterator<google::protobuf::internal::RepeatedPtrIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this,(iterator_type)__x.it_);
  return (reverse_iterator)
         (RepeatedPtrIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )this;
}

Assistant:

reverse_iterator rbegin() { return reverse_iterator(end()); }